

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall
font2svg::glyph::svgheader_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  ostream *poVar1;
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  std::__cxx11::string::~string(local_40);
  poVar1 = std::operator<<((ostream *)&this->field_0x270,"\n<svg width=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbwidth);
  poVar1 = std::operator<<(poVar1,"px\'");
  poVar1 = std::operator<<(poVar1," height=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbheight);
  poVar1 = std::operator<<(poVar1,"px\'");
  std::operator<<(poVar1," xmlns=\'http://www.w3.org/2000/svg\' version=\'1.1\'>");
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgheader() {
		tmp.str("");

		tmp << "\n<svg width='" << bbwidth << "px'"
			<< " height='" << bbheight << "px'"
			<< " xmlns='http://www.w3.org/2000/svg' version='1.1'>";

		return tmp.str();
	}